

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O3

bool __thiscall Memory::ReferencedArenaAdapter::AddStrongReference(ReferencedArenaAdapter *this)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  
  CCLock::Enter(&(this->adapterLock).super_CCLock);
  bVar1 = this->deleteFlag;
  if (bVar1 == true) {
    this_00 = &this->arena->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    if ((this_00 != (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0) &&
       (this->strongRefCount == 0)) {
      ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
                (this_00);
      HeapAllocator::Free(&HeapAllocator::Instance,this_00,0x80);
      this->arena = (ArenaAllocator *)0x0;
    }
  }
  else {
    this->strongRefCount = this->strongRefCount + 1;
  }
  CCLock::Leave(&(this->adapterLock).super_CCLock);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool AddStrongReference()
    {
        bool retval = false;
        adapterLock.Enter();

        if (deleteFlag)
        {
            // Arena exists and is marked deleted, we must fail to acquire a new reference
            if (arena && 0 == strongRefCount)
            {
                // All strong references are gone, delete the arena
                HeapDelete(this->arena);
                this->arena = nullptr;
            }
        }
        else
        {
            // Succeed at acquiring a Strong Reference into the Arena
            strongRefCount++;
            retval = true;
        }

        adapterLock.Leave();

        return retval;
    }